

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qedidparser.cpp
# Opt level: O1

bool __thiscall QEdidParser::parse(QEdidParser *this,QByteArray *blob)

{
  QList<QList<unsigned_short>_> *this_00;
  char *pcVar1;
  quint8 qVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  QArrayData *pQVar6;
  char16_t *pcVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  char cVar24;
  int iVar25;
  QString *pQVar26;
  pointer puVar27;
  void *pvVar28;
  size_t __n;
  storage_type *psVar29;
  uint uVar30;
  qsizetype qVar31;
  char *pcVar32;
  QString *pQVar33;
  QEdidParser *this_01;
  storage_type *psVar34;
  difference_type __d;
  long lVar35;
  ulong uVar36;
  byte bVar37;
  uint uVar38;
  size_t __n_00;
  quint8 *data;
  ulong uVar39;
  QEdidVendorId *__s1;
  ulong uVar40;
  long in_FS_OFFSET;
  bool bVar41;
  qreal qVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [16];
  undefined1 auVar48 [14];
  undefined1 auVar49 [16];
  undefined1 auVar50 [14];
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  char pnpId [3];
  char buf [512];
  QArrayData *local_2a8;
  char16_t *pcStack_2a0;
  QList<unsigned_short> local_288;
  undefined1 *local_268;
  undefined1 *puStack_260;
  QString local_258;
  ushort local_23b;
  byte local_239;
  QString local_238 [21];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar32 = (blob->d).ptr;
  uVar5 = (blob->d).size;
  if (pcVar32 == (char *)0x0) {
    pcVar32 = (char *)&QByteArray::_empty;
  }
  if (((uVar5 < 0x80) || (*pcVar32 != '\0')) || (pcVar32[1] != -1)) {
    bVar41 = false;
    goto LAB_00681dea;
  }
  local_23b = CONCAT11((byte)pcVar32[9] >> 5 | (pcVar32[8] & 3U) << 3,(byte)pcVar32[8] >> 2) &
              0xff1f | 0x4040;
  local_239 = pcVar32[9] & 0x1fU | 0x40;
  pQVar6 = &((this->manufacturer).d.d)->super_QArrayData;
  (this->manufacturer).d.d = (Data *)0x0;
  (this->manufacturer).d.ptr = (char16_t *)0x0;
  (this->manufacturer).d.size = 0;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  uVar30 = *(uint *)(pcVar32 + 0xc);
  this_01 = (QEdidParser *)(ulong)uVar30;
  if (uVar30 == 0) {
    pQVar6 = &((this->serialNumber).d.d)->super_QArrayData;
    (this->serialNumber).d.d = (Data *)0x0;
    (this->serialNumber).d.ptr = (char16_t *)0x0;
    (this->serialNumber).d.size = 0;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar25 = (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
      goto joined_r0x00681efa;
    }
  }
  else {
    QString::number((uint)local_238,uVar30);
    pQVar6 = &((this->serialNumber).d.d)->super_QArrayData;
    pcVar7 = (this->serialNumber).d.ptr;
    (this->serialNumber).d.d = local_238[0].d.d;
    (this->serialNumber).d.ptr = local_238[0].d.ptr;
    qVar31 = (this->serialNumber).d.size;
    (this->serialNumber).d.size = local_238[0].d.size;
    local_238[0].d.d = (Data *)pQVar6;
    local_238[0].d.ptr = pcVar7;
    local_238[0].d.size = qVar31;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      iVar25 = (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i;
      UNLOCK();
joined_r0x00681efa:
      if (iVar25 == 0) {
        this_01 = (QEdidParser *)0x2;
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  data = (quint8 *)(pcVar32 + 0x3b);
  lVar35 = 4;
  do {
    if (((data[-5] == '\0') && (data[-4] == '\0')) && (data[-3] == '\0')) {
      qVar2 = data[-2];
      if (qVar2 == 0xff) {
        parseEdidString(local_238,this_01,data);
        pQVar6 = &((this->serialNumber).d.d)->super_QArrayData;
        pcVar7 = (this->serialNumber).d.ptr;
        (this->serialNumber).d.d = local_238[0].d.d;
        (this->serialNumber).d.ptr = local_238[0].d.ptr;
        qVar31 = (this->serialNumber).d.size;
        (this->serialNumber).d.size = local_238[0].d.size;
        local_238[0].d.d = (Data *)pQVar6;
        local_238[0].d.ptr = pcVar7;
      }
      else if (qVar2 == 0xfe) {
        parseEdidString(local_238,this_01,data);
        pQVar6 = &((this->identifier).d.d)->super_QArrayData;
        pcVar7 = (this->identifier).d.ptr;
        (this->identifier).d.d = local_238[0].d.d;
        (this->identifier).d.ptr = local_238[0].d.ptr;
        qVar31 = (this->identifier).d.size;
        (this->identifier).d.size = local_238[0].d.size;
        local_238[0].d.d = (Data *)pQVar6;
        local_238[0].d.ptr = pcVar7;
      }
      else {
        if (qVar2 != 0xfc) goto LAB_00681f32;
        parseEdidString(local_238,this_01,data);
        pQVar6 = &((this->model).d.d)->super_QArrayData;
        pcVar7 = (this->model).d.ptr;
        (this->model).d.d = local_238[0].d.d;
        (this->model).d.ptr = local_238[0].d.ptr;
        qVar31 = (this->model).d.size;
        (this->model).d.size = local_238[0].d.size;
        local_238[0].d.d = (Data *)pQVar6;
        local_238[0].d.ptr = pcVar7;
      }
      local_238[0].d.size = qVar31;
      if (&(local_238[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
        ;
        UNLOCK();
        if (((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
        {
          this_01 = (QEdidParser *)0x2;
          QArrayData::deallocate(&(local_238[0].d.d)->super_QArrayData,2,0x10);
        }
      }
    }
LAB_00681f32:
    data = data + 0x12;
    lVar35 = lVar35 + -1;
  } while (lVar35 != 0);
  pQVar26 = (QString *)memchr(&local_23b,0,3);
  pQVar33 = local_238;
  if (pQVar26 != (QString *)0x0) {
    pQVar33 = pQVar26;
  }
  local_258.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_258.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_258.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QVar51.m_data = (storage_type *)0x19;
  QVar51.m_size = (qsizetype)local_238;
  QString::fromLatin1(QVar51);
  local_258.d.d = local_238[0].d.d;
  local_258.d.ptr = local_238[0].d.ptr;
  local_258.d.size = local_238[0].d.size;
  local_268 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_260 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_268,&local_258);
  cVar24 = QFile::open((QFile *)&local_268,1);
  if (cVar24 == '\0') {
LAB_00682140:
    pcStack_2a0 = (char16_t *)0x0;
    local_2a8 = (QArrayData *)0x0;
    qVar31 = 0;
  }
  else {
    memset(local_238,0xaa,0x200);
    cVar24 = QFileDevice::atEnd();
    local_2a8 = (QArrayData *)0x0;
    pcStack_2a0 = (char16_t *)0x0;
    if (cVar24 == '\0') {
      do {
        lVar35 = QIODevice::readLine((char *)&local_268,(longlong)local_238);
        if ((lVar35 < 0) || (lVar35 == 0x200)) break;
        __n_00 = lVar35 - 1;
        if ((__n_00 != 0) && ((char)local_238[0].d.d != '#')) {
          if ((lVar35 < 2) || (pvVar28 = memchr(local_238,9,__n_00), pvVar28 == (void *)0x0)) {
            __n = 0xffffffffffffffff;
          }
          else {
            __n = (long)pvVar28 - (long)local_238;
          }
          if ((((0 < (long)__n) &&
               (psVar34 = (storage_type *)(__n_00 - (__n + 1)), psVar34 != (storage_type *)0x0)) &&
              (__n == (long)pQVar33 - (long)&local_23b)) &&
             (iVar25 = bcmp(local_238,&local_23b,__n), iVar25 == 0)) {
            psVar29 = (storage_type *)0x0;
            if (0 < (long)psVar34) {
              psVar29 = psVar34;
            }
            if ((long)psVar34 < 0) {
              psVar29 = (storage_type *)strlen((char *)((long)&local_238[0].d.d + __n + 1));
            }
            QVar54.m_data = psVar29;
            QVar54.m_size = (qsizetype)&local_288;
            QString::fromUtf8(QVar54);
            local_2a8 = &(local_288.d.d)->super_QArrayData;
            pcStack_2a0 = (char16_t *)local_288.d.ptr;
            qVar31 = local_288.d.size;
            goto LAB_00682147;
          }
        }
        cVar24 = QFileDevice::atEnd();
      } while (cVar24 == '\0');
      goto LAB_00682140;
    }
    qVar31 = 0;
  }
LAB_00682147:
  QFile::~QFile((QFile *)&local_268);
  if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar6 = &((this->manufacturer).d.d)->super_QArrayData;
  (this->manufacturer).d.d = (Data *)local_2a8;
  (this->manufacturer).d.ptr = pcStack_2a0;
  (this->manufacturer).d.size = qVar31;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if ((this->manufacturer).d.size == 0) {
    __s1 = q_edidVendorIds;
    uVar39 = 0x9fb;
    do {
      uVar40 = uVar39 >> 1;
      iVar25 = strncmp(__s1[uVar40].id,(char *)&local_23b,3);
      if (iVar25 < 0) {
        __s1 = __s1 + uVar40 + 1;
        uVar40 = ~uVar40 + uVar39;
      }
      uVar39 = uVar40;
    } while (0 < (long)uVar40);
    if ((__s1 != (QEdidVendorId *)&DAT_006e164c) &&
       (iVar25 = strncmp(__s1->id,(char *)&local_23b,3), iVar25 == 0)) {
      psVar34 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar34 + (long)("Avolites Ltd" +
                                 (ulong)*(ushort *)
                                         ((long)q_edidVendorNamesOffsets +
                                         ((long)(__s1 + -0x1b7b98) >> 1)) + 1);
        psVar34 = psVar34 + 1;
      } while (*pcVar1 != '\0');
      QVar52.m_data = psVar34;
      QVar52.m_size = (qsizetype)local_238;
      QString::fromUtf8(QVar52);
      pQVar6 = &((this->manufacturer).d.d)->super_QArrayData;
      pcVar7 = (this->manufacturer).d.ptr;
      (this->manufacturer).d.d = local_238[0].d.d;
      (this->manufacturer).d.ptr = local_238[0].d.ptr;
      qVar31 = (this->manufacturer).d.size;
      (this->manufacturer).d.size = local_238[0].d.size;
      local_238[0].d.d = (Data *)pQVar6;
      local_238[0].d.ptr = pcVar7;
      local_238[0].d.size = qVar31;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,2,0x10);
        }
      }
    }
  }
  if ((this->manufacturer).d.size == 0) {
    QVar53.m_data = (storage_type *)0x3;
    QVar53.m_size = (qsizetype)local_238;
    QString::fromUtf8(QVar53);
    pQVar6 = &((this->manufacturer).d.d)->super_QArrayData;
    pcVar7 = (this->manufacturer).d.ptr;
    (this->manufacturer).d.d = local_238[0].d.d;
    (this->manufacturer).d.ptr = local_238[0].d.ptr;
    qVar31 = (this->manufacturer).d.size;
    (this->manufacturer).d.size = local_238[0].d.size;
    local_238[0].d.d = (Data *)pQVar6;
    local_238[0].d.ptr = pcVar7;
    local_238[0].d.size = qVar31;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  uVar4 = *(ushort *)(pcVar32 + 0x15);
  (this->physicalSize).wd = (double)(uVar4 & 0xff) * 10.0;
  (this->physicalSize).ht = (double)(byte)(uVar4 >> 8) * 10.0;
  bVar37 = pcVar32[0x17];
  qVar42 = 0.0;
  if (bVar37 != 0xff) {
    qVar42 = (double)((float)bVar37 / 100.0) + 1.0;
  }
  this->gamma = qVar42;
  this->useTables = bVar37 == 0xff;
  this->sRgb = (bool)((byte)pcVar32[0x18] >> 2 & 1);
  bVar37 = pcVar32[0x19];
  bVar3 = pcVar32[0x1a];
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar32 + 0x1b) >> 8),
                       *(undefined2 *)(pcVar32 + 0x1b)) & 0xffffffffffff00ff;
  auVar44 = psllw(auVar43,2);
  auVar45._8_6_ = 0;
  auVar45._0_8_ = (ulong)(bVar37 >> 6) | (ulong)(bVar37 >> 4 & 3) << 0x10;
  auVar45 = auVar45 | auVar44._0_14_;
  auVar48._10_2_ = 0;
  auVar48._0_10_ = auVar45._0_10_;
  auVar48._12_2_ = auVar45._6_2_;
  auVar12._8_2_ = auVar45._4_2_;
  auVar12._0_8_ = auVar45._0_8_;
  auVar12._10_4_ = auVar48._10_4_;
  auVar20._6_8_ = 0;
  auVar20._0_6_ = auVar12._8_6_;
  auVar16._4_2_ = auVar45._2_2_;
  auVar16._0_4_ = auVar45._0_4_;
  auVar16._6_8_ = SUB148(auVar20 << 0x40,6);
  auVar46._8_6_ = 0;
  auVar46._0_8_ = (ulong)(bVar37 >> 2) | (ulong)bVar37 << 0x10;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar32 + 0x1d) >> 8),
                       *(undefined2 *)(pcVar32 + 0x1d)) & 0xffffffffffff00ff;
  auVar44 = psllw(auVar49,2);
  auVar48 = auVar44._0_14_ | auVar46 & DAT_006dee50._0_14_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar32 + 0x1f) >> 8),
                       *(undefined2 *)(pcVar32 + 0x1f)) & 0xffffffffffff00ff;
  auVar44 = psllw(auVar44,2);
  auVar50._8_6_ = 0;
  auVar50._0_8_ = (ulong)(bVar3 >> 6) | (ulong)(bVar3 >> 4 & 3) << 0x10;
  auVar50 = auVar50 | auVar44._0_14_;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar48._0_10_;
  auVar9._12_2_ = auVar48._6_2_;
  auVar13._8_2_ = auVar48._4_2_;
  auVar13._0_8_ = auVar48._0_8_;
  auVar13._10_4_ = auVar9._10_4_;
  auVar21._6_8_ = 0;
  auVar21._0_6_ = auVar13._8_6_;
  auVar17._4_2_ = auVar48._2_2_;
  auVar17._0_4_ = auVar48._0_4_;
  auVar17._6_8_ = SUB148(auVar21 << 0x40,6);
  auVar10._10_2_ = 0;
  auVar10._0_10_ = auVar50._0_10_;
  auVar10._12_2_ = auVar50._6_2_;
  auVar14._8_2_ = auVar50._4_2_;
  auVar14._0_8_ = auVar50._0_8_;
  auVar14._10_4_ = auVar10._10_4_;
  auVar22._6_8_ = 0;
  auVar22._0_6_ = auVar14._8_6_;
  auVar18._4_2_ = auVar50._2_2_;
  auVar18._0_4_ = auVar50._0_4_;
  auVar18._6_8_ = SUB148(auVar22 << 0x40,6);
  auVar8._8_6_ = 0;
  auVar8._0_8_ = (ulong)(bVar3 >> 2) | (ulong)bVar3 << 0x10;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (ulong)CONCAT12((char)((ushort)*(undefined2 *)(pcVar32 + 0x21) >> 8),
                       *(undefined2 *)(pcVar32 + 0x21)) & 0xffffffffffff00ff;
  auVar44 = psllw(auVar47,2);
  auVar46 = auVar44._0_14_ | auVar8 & DAT_006dee50._0_14_;
  (this->redChromaticity).xp = (double)((float)(auVar45._0_4_ & 0xffff) * 0.0009765625);
  (this->redChromaticity).yp = (double)((float)auVar16._4_4_ * 0.0009765625);
  (this->greenChromaticity).xp = (double)((float)(auVar48._0_4_ & 0xffff) * 0.0009765625);
  (this->greenChromaticity).yp = (double)((float)auVar17._4_4_ * 0.0009765625);
  auVar11._10_2_ = 0;
  auVar11._0_10_ = auVar46._0_10_;
  auVar11._12_2_ = auVar46._6_2_;
  auVar15._8_2_ = auVar46._4_2_;
  auVar15._0_8_ = auVar46._0_8_;
  auVar15._10_4_ = auVar11._10_4_;
  auVar23._6_8_ = 0;
  auVar23._0_6_ = auVar15._8_6_;
  auVar19._4_2_ = auVar46._2_2_;
  auVar19._0_4_ = auVar46._0_4_;
  auVar19._6_8_ = SUB148(auVar23 << 0x40,6);
  (this->blueChromaticity).xp = (double)((float)(auVar50._0_4_ & 0xffff) * 0.0009765625);
  (this->blueChromaticity).yp = (double)((float)auVar18._4_4_ * 0.0009765625);
  (this->whiteChromaticity).xp = (double)((float)(auVar46._0_4_ & 0xffff) * 0.0009765625);
  (this->whiteChromaticity).yp = (double)((float)auVar19._4_4_ * 0.0009765625);
  bVar41 = uVar5 < 0x100;
  if (!bVar41) {
    this_00 = &this->tables;
    uVar39 = 1;
    do {
      uVar30 = (int)uVar39 << 7;
      if (pcVar32[uVar30] == '@') {
        uVar38 = (byte)pcVar32[(ulong)uVar30 + 0x51] & 0x3f;
        uVar40 = (ulong)uVar38;
        uVar30 = (byte)pcVar32[(ulong)uVar30 + 0x51] & 0xffffffc0;
        bVar37 = (byte)uVar38;
        if (uVar30 == 0x80) {
          if (0xf < bVar37) break;
          local_238[0].d.d = (Data *)0x0;
          local_238[0].d.ptr = (char16_t *)0x0;
          local_238[0].d.size = 0;
          local_258.d.d = (Data *)0x0;
          local_258.d.ptr = (char16_t *)0x0;
          local_258.d.size = 0;
          local_288.d.d = (Data *)0x0;
          local_288.d.ptr = (unsigned_short *)0x0;
          local_288.d.size = 0;
          uVar36 = (ulong)(uVar38 + 1);
          QList<unsigned_short>::reserve(&local_288,uVar36);
          QList<unsigned_short>::reserve((QList<unsigned_short> *)&local_258,uVar36);
          QList<unsigned_short>::reserve((QList<unsigned_short> *)local_238,uVar36);
          if (bVar37 != 0) {
            uVar36 = 0;
            do {
              cVar24 = pcVar32[uVar36 + 0x52];
              puVar27 = QList<unsigned_short>::data(&local_288);
              puVar27[uVar36] = CONCAT11(cVar24,cVar24);
              uVar36 = uVar36 + 1;
            } while (uVar40 != uVar36);
          }
          puVar27 = QList<unsigned_short>::data(&local_288);
          puVar27[uVar40] = 0xffff;
          if (bVar37 != 0) {
            uVar36 = 0;
            do {
              cVar24 = pcVar32[uVar36 + 0x61];
              puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_258);
              puVar27[uVar36] = CONCAT11(cVar24,cVar24);
              uVar36 = uVar36 + 1;
            } while (uVar40 != uVar36);
          }
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)&local_258);
          puVar27[uVar40] = 0xffff;
          if (bVar37 != 0) {
            uVar36 = 0;
            do {
              cVar24 = pcVar32[uVar36 + 0x70];
              puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)local_238);
              puVar27[uVar36] = CONCAT11(cVar24,cVar24);
              uVar36 = uVar36 + 1;
            } while (uVar40 != uVar36);
          }
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)local_238);
          puVar27[uVar40] = 0xffff;
          QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
                    ((QMovableArrayOps<QList<unsigned_short>> *)this_00,(this->tables).d.size,
                     (QList<unsigned_short> *)local_238);
          QList<QList<unsigned_short>_>::end(this_00);
          QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
                    ((QMovableArrayOps<QList<unsigned_short>> *)this_00,(this->tables).d.size,
                     (QList<unsigned_short> *)&local_258);
          QList<QList<unsigned_short>_>::end(this_00);
          QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
                    ((QMovableArrayOps<QList<unsigned_short>> *)this_00,(this->tables).d.size,
                     &local_288);
          QList<QList<unsigned_short>_>::end(this_00);
          if (&(local_288.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_288.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_288.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_258.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_258.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_258.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_238[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_238[0].d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else if (uVar30 == 0x40) {
          if (0x2d < bVar37) break;
          local_238[0].d.d = (Data *)0x0;
          local_238[0].d.ptr = (char16_t *)0x0;
          local_238[0].d.size = 0;
          QList<unsigned_short>::reserve((QList<unsigned_short> *)local_238,uVar40 + 1);
          if (bVar37 != 0) {
            uVar40 = 0;
            do {
              cVar24 = pcVar32[uVar40 + 0x52];
              puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)local_238);
              puVar27[uVar40] = CONCAT11(cVar24,cVar24);
              uVar40 = uVar40 + 1;
            } while (bVar37 != uVar40);
          }
          puVar27 = QList<unsigned_short>::data((QList<unsigned_short> *)local_238);
          puVar27[bVar37] = 0xffff;
          QtPrivate::QMovableArrayOps<QList<unsigned_short>>::emplace<QList<unsigned_short>const&>
                    ((QMovableArrayOps<QList<unsigned_short>> *)this_00,(this->tables).d.size,
                     (QList<unsigned_short> *)local_238);
          QList<QList<unsigned_short>_>::end(this_00);
          if (&(local_238[0].d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 + -1;
            UNLOCK();
            if (((local_238[0].d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                == 0) {
              QArrayData::deallocate(&(local_238[0].d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      uVar39 = (ulong)((int)uVar39 + 1);
      bVar41 = uVar5 >> 7 <= uVar39;
    } while (uVar39 < uVar5 >> 7);
  }
LAB_00681dea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar41;
  }
  __stack_chk_fail();
}

Assistant:

bool QEdidParser::parse(const QByteArray &blob)
{
    const quint8 *data = reinterpret_cast<const quint8 *>(blob.constData());
    const size_t length = blob.size();

    // Verify header
    if (length < 128)
        return false;
    if (data[0] != 0x00 || data[1] != 0xff)
        return false;

    /* Decode the PNP ID from three 5 bit words packed into 2 bytes
     * /--08--\/--09--\
     * 7654321076543210
     * |\---/\---/\---/
     * R  C1   C2   C3 */
    char pnpId[3];
    pnpId[0] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x7c) / 4) - 1;
    pnpId[1] = 'A' + ((data[EDID_OFFSET_PNP_ID] & 0x3) * 8) + ((data[EDID_OFFSET_PNP_ID + 1] & 0xe0) / 32) - 1;
    pnpId[2] = 'A' + (data[EDID_OFFSET_PNP_ID + 1] & 0x1f) - 1;

    // Clear manufacturer
    manufacturer = QString();

    // Serial number, will be overwritten by an ASCII descriptor
    // when and if it will be found
    quint32 serial = data[EDID_OFFSET_SERIAL]
            + (data[EDID_OFFSET_SERIAL + 1] << 8)
            + (data[EDID_OFFSET_SERIAL + 2] << 16)
            + (data[EDID_OFFSET_SERIAL + 3] << 24);
    if (serial > 0)
        serialNumber = QString::number(serial);
    else
        serialNumber = QString();

    // Parse EDID data
    for (int i = 0; i < EDID_DATA_BLOCK_COUNT; ++i) {
        const uint offset = EDID_OFFSET_DATA_BLOCKS + i * 18;

        if (data[offset] != 0 || data[offset + 1] != 0 || data[offset + 2] != 0)
            continue;

        if (data[offset + 3] == EDID_DESCRIPTOR_PRODUCT_NAME)
            model = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_ALPHANUMERIC_STRING)
            identifier = parseEdidString(&data[offset + 5]);
        else if (data[offset + 3] == EDID_DESCRIPTOR_SERIAL_NUMBER)
            serialNumber = parseEdidString(&data[offset + 5]);
    }

    // Try to use cache first because it is potentially more updated
    manufacturer = lookupVendorIdInSystemDatabase(pnpId);

    if (manufacturer.isEmpty()) {
        // Find the manufacturer from the vendor lookup table
        const auto compareVendorId = [](const QEdidVendorId &vendor, const char *str)
        {
            return strncmp(vendor.id, str, 3) < 0;
        };

        const auto b = std::begin(q_edidVendorIds);
        const auto e = std::end(q_edidVendorIds);
        auto it = std::lower_bound(b,
                                   e,
                                   pnpId,
                                   compareVendorId);

        if (it != e && strncmp(it->id, pnpId, 3) == 0)
            manufacturer = QString::fromUtf8(q_edidVendorNames + q_edidVendorNamesOffsets[it - b]);
    }

    // If we don't know the manufacturer, fallback to PNP ID
    if (manufacturer.isEmpty())
        manufacturer = QString::fromUtf8(pnpId, std::size(pnpId));

    // Physical size
    physicalSize = QSizeF(data[EDID_PHYSICAL_WIDTH], data[EDID_OFFSET_PHYSICAL_HEIGHT]) * 10;

    // Gamma and transfer function
    const uint igamma = data[EDID_TRANSFER_FUNCTION];
    if (igamma != 0xff) {
        gamma = 1.0 + (igamma / 100.0f);
        useTables = false;
    } else {
        gamma = 0.0; // Defined in DI-EXT
        useTables = true;
    }
    sRgb = data[EDID_FEATURE_SUPPORT] & 0x04;

    // Chromaticities
    int rx = (data[EDID_CHROMATICITIES_BLOCK] >> 6) & 0x03;
    int ry = (data[EDID_CHROMATICITIES_BLOCK] >> 4) & 0x03;
    int gx = (data[EDID_CHROMATICITIES_BLOCK] >> 2) & 0x03;
    int gy = (data[EDID_CHROMATICITIES_BLOCK] >> 0) & 0x03;
    int bx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 6) & 0x03;
    int by = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 4) & 0x03;
    int wx = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 2) & 0x03;
    int wy = (data[EDID_CHROMATICITIES_BLOCK + 1] >> 0) & 0x03;
    rx |= data[EDID_CHROMATICITIES_BLOCK + 2] << 2;
    ry |= data[EDID_CHROMATICITIES_BLOCK + 3] << 2;
    gx |= data[EDID_CHROMATICITIES_BLOCK + 4] << 2;
    gy |= data[EDID_CHROMATICITIES_BLOCK + 5] << 2;
    bx |= data[EDID_CHROMATICITIES_BLOCK + 6] << 2;
    by |= data[EDID_CHROMATICITIES_BLOCK + 7] << 2;
    wx |= data[EDID_CHROMATICITIES_BLOCK + 8] << 2;
    wy |= data[EDID_CHROMATICITIES_BLOCK + 9] << 2;

    redChromaticity.setX(rx * (1.0f / 1024.0f));
    redChromaticity.setY(ry * (1.0f / 1024.0f));
    greenChromaticity.setX(gx * (1.0f / 1024.0f));
    greenChromaticity.setY(gy * (1.0f / 1024.0f));
    blueChromaticity.setX(bx * (1.0f / 1024.0f));
    blueChromaticity.setY(by * (1.0f / 1024.0f));
    whiteChromaticity.setX(wx * (1.0f / 1024.0f));
    whiteChromaticity.setY(wy * (1.0f / 1024.0f));

    // Find extensions
    for (uint i = 1; i < length / 128; ++i) {
        uint extensionId = data[i * 128];
        if (extensionId == 0x40) { // DI-EXT
            // 0x0E (sub-pixel layout)
            // 0x20->0x22 (bits per color)
            // 0x51->0x7e Transfer characteristics
            const uchar desc = data[i * 128 + 0x51];
            const uchar len = desc & 0x3f;
            if ((desc & 0xc0) == 0x40) {
                if (len > 45)
                    return false;
                QList<uint16_t> whiteTRC;
                whiteTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    whiteTRC[j] = data[0x52 + j] * 0x101;
                whiteTRC[len] = 0xffff;
                tables.append(whiteTRC);
            } else if ((desc & 0xc0) == 0x80) {
                if (len > 15)
                    return false;
                QList<uint16_t> redTRC;
                QList<uint16_t> greenTRC;
                QList<uint16_t> blueTRC;
                blueTRC.reserve(len + 1);
                greenTRC.reserve(len + 1);
                redTRC.reserve(len + 1);
                for (uint j = 0; j < len; ++j)
                    blueTRC[j] = data[0x52 + j] * 0x101;
                blueTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    greenTRC[j] = data[0x61 + j] * 0x101;
                greenTRC[len] = 0xffff;
                for (uint j = 0; j < len; ++j)
                    redTRC[j] = data[0x70 + j] * 0x101;
                redTRC[len] = 0xffff;
                tables.append(redTRC);
                tables.append(greenTRC);
                tables.append(blueTRC);
            }
        }
    }

    return true;
}